

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  char cVar1;
  bool bVar2;
  Nullability NVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  HeapType HVar6;
  undefined1 auVar7 [8];
  Iterator IVar8;
  Type local_90;
  Type local_88;
  Type *local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  undefined1 local_58 [8];
  Iterator __begin2;
  Type local_38;
  Type type_local;
  
  local_38.id = type.id;
  cVar1 = ::wasm::Type::isTuple();
  if (cVar1 != '\0') {
    auStack_78 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])&local_38;
    IVar8 = Type::end(&local_38);
    local_80 = IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    pTVar4 = (Type *)0x0;
    auVar7 = (undefined1  [8])&local_38;
    while ((pTVar4 != (Type *)IVar8.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index || (auVar7 != (undefined1  [8])local_80))) {
      puVar5 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_58);
      local_88 = getSubType(this,*puVar5);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78,&local_88);
      pTVar4 = (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      auVar7 = local_58;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar4;
    }
    Tuple::Tuple((Tuple *)local_58,(TypeList *)auStack_78);
    ::wasm::Type::Type(&local_90,(Tuple *)local_58);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78);
    return (Type)local_90.id;
  }
  cVar1 = ::wasm::Type::isRef();
  if (cVar1 != '\0') {
    HVar6.id = ::wasm::Type::getHeapType();
    HVar6 = getSubType(this,HVar6);
    NVar3 = ::wasm::Type::getNullability();
    NVar3 = getSubType(this,NVar3);
    ::wasm::Type::Type((Type *)auStack_78,HVar6,NVar3);
    bVar2 = isUninhabitable((Type)auStack_78);
    if (((!bVar2) || (bVar2 = isUninhabitable(local_38), bVar2)) ||
       (bVar2 = Random::oneIn(&this->random,0x14), pTVar4 = &local_38, bVar2)) {
      pTVar4 = (Type *)auStack_78;
    }
    return (Type)pTVar4->id;
  }
  if (local_38.id < 7) {
    return (Type)local_38.id;
  }
  __assert_fail("type.isBasic()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xdbf,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = getSubType(type.getHeapType());
    auto nullability = getSubType(type.getNullability());
    auto subType = Type(heapType, nullability);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (isUninhabitable(subType) && !isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}